

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.c
# Opt level: O1

void state_set_value(apx_vm_writeState_t *self,dtl_dv_t *dv)

{
  dtl_dv_type_id dVar1;
  
  if (self == (apx_vm_writeState_t *)0x0) {
    __assert_fail("self != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                  ,0x3ac,"void state_set_value(apx_vm_writeState_t *, const dtl_dv_t *)");
  }
  dVar1 = dtl_dv_type(dv);
  self->value_type = dVar1;
  adt_str_clear(&self->field_name);
  (self->scalar_value).i32 = 0;
  self->index = 0;
  self->array_len = 0;
  self->max_array_len = 0;
  self->element_size = 0;
  self->scalar_storage_type = '\0';
  self->type_code = '\0';
  self->is_last_field = false;
  self->dynamic_size_type = '\0';
  self->range_check_state = '\0';
  switch(self->value_type) {
  case DTL_DV_INVALID:
  case DTL_DV_NULL:
    dv = (dtl_dv_t *)0x0;
  case DTL_DV_SCALAR:
  case DTL_DV_ARRAY:
  case DTL_DV_HASH:
    (self->value).dv = dv;
  default:
    return;
  }
}

Assistant:

static void state_set_value(apx_vm_writeState_t* self, dtl_dv_t const* dv)
{
   assert(self != NULL);
   state_reset(self, dtl_dv_type(dv));
   switch (self->value_type)
   {
   case DTL_DV_INVALID:
   case DTL_DV_NULL:
      self->value.dv = NULL;
      break;
   case DTL_DV_SCALAR:
      self->value.sv = (dtl_sv_t*)dv;
      break;
   case DTL_DV_ARRAY:
      self->value.av = (dtl_av_t*)dv;
      break;
   case DTL_DV_HASH:
      self->value.hv = (dtl_hv_t*)dv;
      break;
   }
}